

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

Block * __thiscall
wasm::I64ToI32Lowering::makeSmallShrU
          (I64ToI32Lowering *this,Index highBits,Index leftLow,Index leftHigh,Index shift,
          Binary *shiftMask,Binary *widthLessShift)

{
  Builder *pBVar1;
  LocalGet *pLVar2;
  Binary *pBVar3;
  LocalGet *pLVar4;
  Binary *right;
  Binary *value;
  LocalSet *any;
  Block *pBVar5;
  
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pLVar2 = Builder::makeLocalGet(pBVar1,leftHigh,(Type)0x2);
  pBVar3 = Builder::makeBinary(pBVar1,AndInt32,(Expression *)shiftMask,(Expression *)pLVar2);
  pBVar3 = Builder::makeBinary(pBVar1,ShlInt32,(Expression *)pBVar3,(Expression *)widthLessShift);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pLVar2 = Builder::makeLocalGet(pBVar1,leftLow,(Type)0x2);
  pLVar4 = Builder::makeLocalGet
                     ((this->builder)._M_t.
                      super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t
                      .super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,shift,(Type)0x2);
  right = Builder::makeBinary(pBVar1,ShrUInt32,(Expression *)pLVar2,(Expression *)pLVar4);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pLVar2 = Builder::makeLocalGet(pBVar1,leftHigh,(Type)0x2);
  pLVar4 = Builder::makeLocalGet
                     ((this->builder)._M_t.
                      super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t
                      .super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,shift,(Type)0x2);
  value = Builder::makeBinary(pBVar1,ShrUInt32,(Expression *)pLVar2,(Expression *)pLVar4);
  any = Builder::makeLocalSet(pBVar1,highBits,(Expression *)value);
  pBVar3 = Builder::makeBinary((this->builder)._M_t.
                               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                               .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,OrInt32,
                               (Expression *)pBVar3,(Expression *)right);
  pBVar5 = Builder::blockify(pBVar1,(Expression *)any,(Expression *)pBVar3);
  return pBVar5;
}

Assistant:

Block* makeSmallShrU(Index highBits,
                       Index leftLow,
                       Index leftHigh,
                       Index shift,
                       Binary* shiftMask,
                       Binary* widthLessShift) {
    Binary* shiftedInBits = builder->makeBinary(
      ShlInt32,
      builder->makeBinary(
        AndInt32, shiftMask, builder->makeLocalGet(leftHigh, Type::i32)),
      widthLessShift);
    Binary* shiftLow =
      builder->makeBinary(ShrUInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(shift, Type::i32));
    return builder->blockify(
      builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShrUInt32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeLocalGet(shift, Type::i32))),
      builder->makeBinary(OrInt32, shiftedInBits, shiftLow));
  }